

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O0

pdu_end_of_data_v1_v2 * end_cache_response(uint8_t version,uint16_t session_id,uint32_t sn)

{
  long lVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  pdu_end_of_data_v1_v2 *ppVar4;
  long in_FS_OFFSET;
  pdu_end_of_data_v1_v2 *eod;
  uint32_t sn_local;
  uint16_t session_id_local;
  uint8_t version_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  data = (char *)lrtr_realloc(data,data_size + 0x18);
  if (data == (char *)0x0) {
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0xa7,
                  "struct pdu_end_of_data_v1_v2 *end_cache_response(uint8_t, uint16_t, uint32_t)");
  }
  ppVar4 = (pdu_end_of_data_v1_v2 *)(data + data_size);
  ppVar4->ver = version;
  ppVar4->type = '\a';
  uVar2 = lrtr_convert_short(TO_HOST_HOST_BYTE_ORDER,session_id);
  ppVar4->session_id = uVar2;
  uVar3 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,0x18);
  ppVar4->len = uVar3;
  uVar3 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,sn);
  ppVar4->sn = uVar3;
  uVar3 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,1);
  ppVar4->refresh_interval = uVar3;
  uVar3 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,1);
  ppVar4->retry_interval = uVar3;
  uVar3 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,600);
  ppVar4->expire_interval = uVar3;
  data_size = data_size + 0x18;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ppVar4;
  }
  __stack_chk_fail();
}

Assistant:

static struct pdu_end_of_data_v1_v2 *end_cache_response(uint8_t version, uint16_t session_id, uint32_t sn)
{
	data = lrtr_realloc(data, data_size + sizeof(struct pdu_end_of_data_v1_v2));
	assert(data);

	struct pdu_end_of_data_v1_v2 *eod = (struct pdu_end_of_data_v1_v2 *)(data + data_size);

	eod->ver = version;
	eod->type = EOD;
	eod->session_id = BYTES16(session_id);
	eod->len = BYTES32(24);
	eod->sn = BYTES32(sn);
	eod->refresh_interval = BYTES32(RTR_REFRESH_MIN);
	eod->retry_interval = BYTES32(RTR_RETRY_MIN);
	eod->expire_interval = BYTES32(RTR_EXPIRATION_MIN);

	data_size += sizeof(struct pdu_end_of_data_v1_v2);

	return eod;
}